

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O1

void jpc_initluts(void)

{
  jpc_mqctx_t *ctx;
  jpc_mqctx_t *pjVar1;
  uint_least8_t *puVar2;
  _Bool *p_Var3;
  int i;
  int iVar4;
  long lVar5;
  int_fast16_t iVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  double x;
  double dVar22;
  float fVar23;
  float fVar24;
  double x_1;
  double dVar25;
  
  pjVar1 = jpc_mqctxs;
  iVar4 = 0;
  do {
    pjVar1->mps = false;
    if (iVar4 == 0) {
      iVar6 = 3;
    }
    else if (iVar4 == 0x12) {
      iVar6 = 0x2e;
    }
    else if (iVar4 == 1) {
      iVar6 = 4;
    }
    else {
      iVar6 = 0;
    }
    pjVar1->ind = iVar6;
    pjVar1 = pjVar1 + 1;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x13);
  puVar2 = jpc_zcctxnolut;
  lVar5 = 0;
  do {
    uVar12 = 0;
    do {
      uVar9 = (uint)uVar12;
      iVar13 = ((uint)(uVar12 >> 7) & 0x1ffffff) + (uint)((uVar9 >> 5 & 1) != 0);
      iVar19 = ((uint)(uVar12 >> 4) & 1) + (uint)((uVar9 >> 6 & 1) != 0);
      uVar16 = (uVar9 & 1) + (uint)((uVar9 >> 3 & 1) != 0);
      iVar4 = ((uint)(uVar12 >> 1) & 1) + uVar16 + (uint)((uVar9 >> 2 & 1) != 0);
      uVar9 = (uint)lVar5;
      iVar10 = iVar13;
      if (uVar9 < 2) {
LAB_00126af6:
        if (iVar10 == 1) {
          uVar16 = 8;
          if (iVar19 == 0) {
            uVar16 = (uint)(iVar4 == 0 ^ 7);
          }
        }
        else {
          uVar16 = 9;
          if (iVar10 == 0) {
            if (iVar19 == 1) {
              uVar16 = 4;
            }
            else if (iVar19 == 0) {
LAB_00126b64:
              uVar16 = (uint)(iVar4 == 1 ^ 3);
              if (iVar4 == 0) {
                uVar16 = 1;
              }
            }
            else {
              uVar16 = 5;
            }
          }
        }
      }
      else if (uVar9 == 3) {
        iVar13 = iVar13 + iVar19;
        if (iVar4 == 2) {
          uVar16 = (uint)(byte)(8 - (iVar13 == 0));
        }
        else if (iVar4 == 1) {
          uVar16 = (uint)(byte)(6 - (iVar13 == 1));
          if (iVar13 == 0) {
            uVar16 = 4;
          }
        }
        else {
          uVar16 = 9;
          bVar7 = iVar4 == 0;
          iVar4 = iVar13;
          if (bVar7) goto LAB_00126b64;
        }
      }
      else {
        iVar10 = iVar19;
        iVar19 = iVar13;
        if (uVar9 == 2) goto LAB_00126af6;
      }
      puVar2[uVar12] = (uint_least8_t)uVar16;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x100);
    lVar5 = lVar5 + 1;
    puVar2 = puVar2 + 0x100;
    if (lVar5 == 4) {
      p_Var3 = jpc_spblut;
      lVar5 = 0;
      do {
        uVar9 = (uint)lVar5;
        uVar17 = uVar9 & 0x220;
        uVar16 = uVar9 & 0x880;
        bVar14 = uVar16 == 0x880 || uVar17 == 0x220;
        uVar20 = uVar9 & 0x110;
        uVar9 = uVar9 & 0x440;
        bVar7 = uVar9 == 0x440 || uVar20 == 0x110;
        bVar18 = bVar14 != (uVar16 == 0x80 || uVar17 == 0x20);
        *p_Var3 = ((uVar16 != 0x80 && uVar17 != 0x20 || bVar14) &&
                  (bVar7 != (uVar9 == 0x40 || uVar20 == 0x10) || bVar18)) &&
                  ((uVar9 != 0x40 && uVar20 != 0x10 || bVar7) || bVar18);
        lVar5 = lVar5 + 0x10;
        p_Var3 = p_Var3 + 1;
      } while (lVar5 != 0x1000);
      puVar2 = jpc_scctxnolut;
      lVar5 = 0;
      do {
        uVar9 = (uint)lVar5;
        iVar10 = (uint)((uVar9 & 0x440) == 0x40 || (uVar9 & 0x110) == 0x10) -
                 (uint)((uVar9 & 0x440) == 0x440 || (uVar9 & 0x110) == 0x110);
        uVar16 = (uint)((uVar9 & 0x880) == 0x80 || (uVar9 & 0x220) == 0x20);
        uVar9 = (uint)((uVar9 & 0x880) == 0x880 || (uVar9 & 0x220) == 0x220);
        iVar4 = -iVar10;
        if (-1 < (int)(uVar16 - uVar9)) {
          iVar4 = iVar10;
        }
        bVar8 = iVar4 == 0 ^ 0x11;
        if (iVar4 == -1) {
          bVar8 = 0xf;
        }
        bVar15 = 0xe - (iVar4 == 0);
        if (uVar16 != uVar9) {
          bVar15 = bVar8;
        }
        *puVar2 = bVar15;
        lVar5 = lVar5 + 0x10;
        puVar2 = puVar2 + 1;
      } while (lVar5 != 0x1000);
      puVar2 = jpc_magctxnolut;
      lVar5 = 0;
      do {
        lVar11 = 0;
        do {
          bVar8 = (char)lVar11 == '\0' ^ 0xb;
          if (lVar5 != 0) {
            bVar8 = 0xc;
          }
          puVar2[lVar11] = bVar8;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x800);
        puVar2 = puVar2 + 0x800;
        bVar7 = lVar5 == 0;
        lVar5 = lVar5 + 1;
      } while (bVar7);
      uVar12 = 0;
      do {
        dVar25 = 1.0;
        uVar9 = 7;
        dVar22 = 1.0;
        do {
          dVar22 = dVar22 * 0.5;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
        fVar21 = (float)(dVar22 * (double)(int)uVar12);
        fVar23 = fVar21 + -1.5;
        uVar9 = 7;
        do {
          dVar25 = dVar25 + dVar25;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
        dVar22 = floor((double)(fVar21 * fVar21 - fVar23 * fVar23) * dVar25 + 0.5);
        jpc_signmsedec[uVar12] = (long)((dVar22 / dVar25) * 8192.0);
        dVar22 = floor((double)(fVar21 * fVar21) * dVar25 + 0.5);
        jpc_signmsedec0[uVar12] = (long)((dVar22 / dVar25) * 8192.0);
        fVar24 = fVar21 + -0.5;
        if (0x3f < uVar12) {
          fVar24 = fVar23;
        }
        fVar21 = (fVar21 + -1.0) * (fVar21 + -1.0);
        dVar22 = floor((double)(fVar21 - fVar24 * fVar24) * dVar25 + 0.5);
        jpc_refnmsedec[uVar12] = (long)((dVar22 / dVar25) * 8192.0);
        dVar22 = floor((double)fVar21 * dVar25 + 0.5);
        jpc_refnmsedec0[uVar12] = (long)((dVar22 / dVar25) * 8192.0);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x80);
      return;
    }
  } while( true );
}

Assistant:

void jpc_initluts()
{
	int i;
	int orient;
	int refine;
	float u;
	float v;
	float t;

/* XXX - hack */
jpc_initmqctxs();

	for (orient = 0; orient < 4; ++orient) {
		for (i = 0; i < 256; ++i) {
			jpc_zcctxnolut[(orient << 8) | i] = jpc_getzcctxno(i, orient);
		}
	}

	for (i = 0; i < 256; ++i) {
		jpc_spblut[i] = jpc_getspb(i << 4);
	}

	for (i = 0; i < 256; ++i) {
		jpc_scctxnolut[i] = jpc_getscctxno(i << 4);
	}

	for (refine = 0; refine < 2; ++refine) {
		for (i = 0; i < 2048; ++i) {
			jpc_magctxnolut[(refine << 11) + i] = jpc_getmagctxno((refine ? JPC_REFINE : 0) | i);
		}
	}

	for (i = 0; i < (1 << JPC_NMSEDEC_BITS); ++i) {
		t = i * jpc_pow2i(-JPC_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		jpc_signmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_signmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
		u = t - 1.0;
		if (i & (1 << (JPC_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		jpc_refnmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_refnmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
	}
}